

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QStyleOptionGraphicsItem>::resize(QList<QStyleOptionGraphicsItem> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  QStyleOptionGraphicsItem *__cur;
  QStyleOptionGraphicsItem *pQVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (pQVar3 = (this->d).ptr,
     ((long)((long)pQVar3 -
            ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) *
     0x5555555555555555 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QStyleOptionGraphicsItem>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QStyleOptionGraphicsItem **)0x0,
               (QArrayDataPointer<QStyleOptionGraphicsItem> *)0x0);
    lVar2 = (this->d).size;
  }
  else {
    lVar2 = (this->d).size;
    if (size < lVar2) {
      pQVar3 = pQVar3 + size;
      lVar2 = lVar2 * 0x60 + size * -0x60;
      do {
        QStyleOption::~QStyleOption(&pQVar3->super_QStyleOption);
        pQVar3 = pQVar3 + 1;
        lVar2 = lVar2 + -0x60;
      } while (lVar2 != 0);
      goto LAB_00637ec8;
    }
  }
  if (size <= lVar2) {
    return;
  }
  pQVar3 = (this->d).ptr + lVar2;
  lVar2 = size * 0x60 + lVar2 * -0x60;
  do {
    QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(pQVar3);
    pQVar3 = pQVar3 + 1;
    lVar2 = lVar2 + -0x60;
  } while (lVar2 != 0);
LAB_00637ec8:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }